

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.cpp
# Opt level: O1

material_table * __thiscall material_table::operator=(material_table *this,material_table *o)

{
  ulong uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 auVar2 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  element_type *peVar4;
  element_type *peVar5;
  ulong uVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  uVar1 = this->count;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar1;
  uVar6 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0x28),8) == 0) {
    uVar6 = SUB168(auVar2 * ZEXT816(0x28),0);
  }
  peVar4 = (element_type *)operator_new__(uVar6);
  if (uVar1 != 0) {
    peVar5 = peVar4;
    do {
      peVar5->endgame_coeff = 0.0;
      peVar5->endgame = KpK;
      peVar5->number[0] = '\0';
      peVar5->number[1] = '\0';
      peVar5->number[2] = '\0';
      peVar5->number[3] = '\0';
      peVar5->key = 0;
      *(undefined8 *)&peVar5->score = 0;
      *(undefined8 *)(peVar5->number + 4) = 0;
      peVar5->endgame = none;
      peVar5 = peVar5 + 1;
    } while (peVar5 != peVar4 + uVar1);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<material_entry*,std::__sp_array_delete,std::allocator<void>,void>
            (&_Stack_20,peVar4);
  _Var3._M_pi = _Stack_20._M_pi;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->entries).super___shared_ptr<material_entry[],_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->entries).super___shared_ptr<material_entry[],_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  (this->entries).super___shared_ptr<material_entry[],_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var3._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
  }
  memcpy((this->entries).super___shared_ptr<material_entry[],_(__gnu_cxx::_Lock_policy)2>._M_ptr,
         (o->entries).super___shared_ptr<material_entry[],_(__gnu_cxx::_Lock_policy)2>._M_ptr,
         this->count * 0x28);
  this->sz_mb = o->sz_mb;
  this->count = o->count;
  return this;
}

Assistant:

material_table& material_table::operator=(const material_table& o) {
	entries = std::shared_ptr<material_entry[]>(new material_entry[count]());
	std::memcpy(entries.get(), o.entries.get(), count * sizeof(material_entry));
	sz_mb = o.sz_mb;
	count = o.count;
	return *this;
}